

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O1

void vkt::anon_unknown_0::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,char *checkVarName)

{
  bool bVar1;
  DataType DVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  
  lVar4 = *(long *)(dstVec4Var + 0x18);
  if (*(long *)(dstVec4Var + 0x20) != lVar4) {
    bVar1 = true;
    lVar6 = 0x20;
    uVar7 = 0;
    do {
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"bool RES = ",0xb);
        bVar1 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"RES = RES && ",0xd);
      }
      DVar2 = glu::getDataTypeScalarType(*(DataType *)(lVar4 + -0x18 + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"isOk(",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)output,*(char **)(lVar4 + -8 + lVar6),*(long *)(lVar4 + lVar6))
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ref.",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(lVar4 + -8 + lVar6),*(long *)(lVar4 + lVar6));
      if (DVar2 == TYPE_FLOAT) {
        lVar4 = 9;
        pcVar5 = ", 0.05);\n";
      }
      else {
        lVar4 = 3;
        pcVar5 = ");\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
      uVar7 = uVar7 + 1;
      lVar4 = *(long *)(dstVec4Var + 0x18);
      lVar6 = lVar6 + 0x50;
    } while (uVar7 < (ulong)((*(long *)(dstVec4Var + 0x20) - lVar4 >> 4) * -0x3333333333333333));
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"dEQP_FragColor",0xe);
      pcVar5 = " = vec4(RES, RES, RES, 1.0);\n";
      lVar4 = 0x1d;
      goto LAB_003b1729;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,"dEQP_FragColor",0xe);
  pcVar5 = " = vec4(1.0);\n";
  lVar4 = 0xe;
LAB_003b1729:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)output,pcVar5,lVar4);
  return;
}

Assistant:

void genCompareOp (ostringstream& output, const char* dstVec4Var, const ValueBlock& valueBlock, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (size_t ndx = 0; ndx < valueBlock.outputs.size(); ndx++)
	{
		const Value&	val		= valueBlock.outputs[ndx];

		// Check if we're only interested in one variable (then skip if not the right one).
		if (checkVarName && val.name != checkVarName)
			continue;

		// Prefix.
		if (isFirstOutput)
		{
			output << "bool RES = ";
			isFirstOutput = false;
		}
		else
			output << "RES = RES && ";

		// Generate actual comparison.
		if (getDataTypeScalarType(val.type.getBasicType()) == glu::TYPE_FLOAT)
			output << "isOk(" << val.name << ", ref." << val.name << ", 0.05);\n";
		else
			output << "isOk(" << val.name << ", ref." << val.name << ");\n";
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n";
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}